

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O1

vector<int,_std::allocator<int>_> *
Intersect<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
              vector<int,_std::allocator<int>_> *A,vector<int,_std::allocator<int>_> *B)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer piVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  int *x;
  pointer piVar9;
  int *x_2;
  vector<int,_std::allocator<int>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> s;
  set<int,_std::less<int>,_std::allocator<int>_> sB;
  set<int,_std::less<int>,_std::allocator<int>_> sA;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_90._M_impl.super__Rb_tree_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar9 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (piVar9 != piVar3) {
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,piVar9);
      piVar9 = piVar9 + 1;
    } while (piVar9 != piVar3);
  }
  piVar9 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar9 != piVar3) {
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_90,piVar9);
      piVar9 = piVar9 + 1;
    } while (piVar9 != piVar3);
  }
  piVar9 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar9 != piVar3) {
    do {
      p_Var5 = &p_Var2->_M_header;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if (*piVar9 <= (int)*(size_t *)(p_Var7 + 1)) {
            p_Var5 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < *piVar9];
        } while (p_Var7 != (_Base_ptr)0x0);
      }
      p_Var6 = p_Var2;
      if (((_Rb_tree_header *)p_Var5 != p_Var2) &&
         (p_Var6 = (_Rb_tree_header *)p_Var5,
         *piVar9 < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var6 = p_Var2;
      }
      if (p_Var6 != p_Var2) {
        p_Var5 = &p_Var1->_M_header;
        if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var7 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (*piVar9 <= (int)*(size_t *)(p_Var7 + 1)) {
              p_Var5 = p_Var7;
            }
            p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < *piVar9];
          } while (p_Var7 != (_Base_ptr)0x0);
        }
        p_Var6 = p_Var1;
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           (p_Var6 = (_Rb_tree_header *)p_Var5,
           *piVar9 < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
          p_Var6 = p_Var1;
        }
        if (p_Var6 != p_Var1) {
          iVar4._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar4,piVar9);
          }
          else {
            *iVar4._M_current = *piVar9;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_c0,piVar9);
        }
      }
      piVar9 = piVar9 + 1;
    } while (piVar9 != piVar3);
  }
  piVar3 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar9 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start; piVar9 != piVar3; piVar9 = piVar9 + 1) {
    p_Var5 = &p_Var2->_M_header;
    if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        if (*piVar9 <= (int)p_Var7[1]._M_color) {
          p_Var5 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < *piVar9];
      } while (p_Var7 != (_Base_ptr)0x0);
    }
    p_Var7 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var2) &&
       (p_Var7 = p_Var5, *piVar9 < (int)p_Var5[1]._M_color)) {
      p_Var7 = &p_Var2->_M_header;
    }
    if ((_Rb_tree_header *)p_Var7 != p_Var2) {
      p_Var5 = &p_Var1->_M_header;
      if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var7 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if (*piVar9 <= (int)p_Var7[1]._M_color) {
            p_Var5 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < *piVar9];
        } while (p_Var7 != (_Base_ptr)0x0);
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var7 = p_Var5, *piVar9 < (int)p_Var5[1]._M_color)) {
        p_Var7 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var7 != p_Var1) {
        p_Var5 = &local_c0._M_impl.super__Rb_tree_header._M_header;
        if (local_c0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var7 = local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (*piVar9 <= (int)*(size_t *)(p_Var7 + 1)) {
              p_Var5 = p_Var7;
            }
            p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < *piVar9];
          } while (p_Var7 != (_Base_ptr)0x0);
        }
        p_Var6 = &local_c0._M_impl.super__Rb_tree_header;
        p_Var8 = p_Var6;
        if (((_Rb_tree_header *)p_Var5 != p_Var6) &&
           (p_Var8 = (_Rb_tree_header *)p_Var5,
           *piVar9 < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
          p_Var8 = p_Var6;
        }
        if (p_Var8 == p_Var6) {
          iVar4._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar4,piVar9);
          }
          else {
            *iVar4._M_current = *piVar9;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
        }
      }
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_c0);
  return __return_storage_ptr__;
}

Assistant:

vector<T> Intersect(const vector<T> &A, const vector<T> &B) {
    vector<T> v;
    set<T> s;
    set<T> sA;
    set<T> sB;
    for (auto &x : A) {
        sA.insert(x);
    }
    for (auto &x : B) {
        sB.insert(x);
    }
    for (auto &x : A) {
        if (sA.find(x) != sA.end() && sB.find(x) != sB.end()) {
            v.emplace_back(x);
            s.insert(x);
        }
    }
    for (auto &x : A) {
        if (sA.find(x) != sA.end() && sB.find(x) != sB.end() && s.find(x) == s.end()) {
            v.emplace_back(x);
        }
    }
    return v;
}